

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

void QSslSocketPrivate::checkSettingSslContext
               (QSslSocket *socket,shared_ptr<QSslContext> tlsContext)

{
  long *plVar1;
  long in_FS_OFFSET;
  undefined8 local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((socket != (QSslSocket *)0x0) &&
     (plVar1 = *(long **)(*(long *)&(socket->super_QTcpSocket).super_QAbstractSocket.field_0x8 +
                         0x408), plVar1 != (long *)0x0)) {
    local_20 = *(undefined8 *)
                tlsContext.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_18 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                (tlsContext.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8);
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_18->_M_use_count = local_18->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_18->_M_use_count = local_18->_M_use_count + 1;
      }
    }
    (**(code **)(*plVar1 + 0x68))
              (plVar1,&local_20,
               tlsContext.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::checkSettingSslContext(QSslSocket* socket, std::shared_ptr<QSslContext> tlsContext)
{
    if (!socket)
        return;

    if (auto *backend = socket->d_func()->backend.get())
        backend->checkSettingSslContext(tlsContext);
}